

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonbPayloadSize(JsonParse *pParse,u32 i,u32 *pSz)

{
  byte bVar1;
  u32 n;
  u32 sz;
  u8 x;
  u32 *pSz_local;
  u32 i_local;
  JsonParse *pParse_local;
  
  if (pParse->nBlob < i) {
    *pSz = 0;
    return 0;
  }
  sz = (int)(uint)pParse->aBlob[i] >> 4;
  bVar1 = (byte)sz;
  if (bVar1 < 0xc) {
    n = 1;
  }
  else if (bVar1 == 0xc) {
    if (pParse->nBlob <= i + 1) {
      *pSz = 0;
      return 0;
    }
    sz = (u32)pParse->aBlob[i + 1];
    n = 2;
  }
  else if (bVar1 == 0xd) {
    if (pParse->nBlob <= i + 2) {
      *pSz = 0;
      return 0;
    }
    sz = (uint)pParse->aBlob[i + 1] * 0x100 + (uint)pParse->aBlob[i + 2];
    n = 3;
  }
  else if (bVar1 == 0xe) {
    if (pParse->nBlob <= i + 4) {
      *pSz = 0;
      return 0;
    }
    sz = (uint)pParse->aBlob[i + 1] * 0x1000000 + (uint)pParse->aBlob[i + 2] * 0x10000 +
         (uint)pParse->aBlob[i + 3] * 0x100 + (uint)pParse->aBlob[i + 4];
    n = 5;
  }
  else {
    if ((((pParse->nBlob <= i + 8) || (pParse->aBlob[i + 1] != '\0')) ||
        (pParse->aBlob[i + 2] != '\0')) ||
       ((pParse->aBlob[i + 3] != '\0' || (pParse->aBlob[i + 4] != '\0')))) {
      *pSz = 0;
      return 0;
    }
    sz = (uint)pParse->aBlob[i + 5] * 0x1000000 + (uint)pParse->aBlob[i + 6] * 0x10000 +
         (uint)pParse->aBlob[i + 7] * 0x100 + (uint)pParse->aBlob[i + 8];
    n = 9;
  }
  if (((ulong)pParse->nBlob < (ulong)i + (ulong)sz + (ulong)n) &&
     ((ulong)(pParse->nBlob - pParse->delta) < (ulong)i + (ulong)sz + (ulong)n)) {
    sz = 0;
    n = 0;
  }
  *pSz = sz;
  return n;
}

Assistant:

static u32 jsonbPayloadSize(const JsonParse *pParse, u32 i, u32 *pSz){
  u8 x;
  u32 sz;
  u32 n;
  if( NEVER(i>pParse->nBlob) ){
    *pSz = 0;
    return 0;
  }
  x = pParse->aBlob[i]>>4;
  if( x<=11 ){
    sz = x;
    n = 1;
  }else if( x==12 ){
    if( i+1>=pParse->nBlob ){
      *pSz = 0;
      return 0;
    }
    sz = pParse->aBlob[i+1];
    n = 2;
  }else if( x==13 ){
    if( i+2>=pParse->nBlob ){
      *pSz = 0;
      return 0;
    }
    sz = (pParse->aBlob[i+1]<<8) + pParse->aBlob[i+2];
    n = 3;
  }else if( x==14 ){
    if( i+4>=pParse->nBlob ){
      *pSz = 0;
      return 0;
    }
    sz = ((u32)pParse->aBlob[i+1]<<24) + (pParse->aBlob[i+2]<<16) +
         (pParse->aBlob[i+3]<<8) + pParse->aBlob[i+4];
    n = 5;
  }else{
    if( i+8>=pParse->nBlob
     || pParse->aBlob[i+1]!=0
     || pParse->aBlob[i+2]!=0
     || pParse->aBlob[i+3]!=0
     || pParse->aBlob[i+4]!=0
    ){
      *pSz = 0;
      return 0;
    }
    sz = (pParse->aBlob[i+5]<<24) + (pParse->aBlob[i+6]<<16) +
         (pParse->aBlob[i+7]<<8) + pParse->aBlob[i+8];
    n = 9;
  }
  if( (i64)i+sz+n > pParse->nBlob
   && (i64)i+sz+n > pParse->nBlob-pParse->delta
  ){
    sz = 0;
    n = 0;
  }
  *pSz = sz;
  return n;
}